

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_wordwrap(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  undefined8 in_RAX;
  char *zString;
  int nLen;
  char *pcVar2;
  char *zString_00;
  int iBreaklen;
  int iLen;
  
  iLen = (int)((ulong)in_RAX >> 0x20);
  if ((nArg < 1) || (zString = jx9_value_to_string(*apArg,&iLen), iLen < 1)) {
    jx9_result_string(pCtx,"",0);
    return 0;
  }
  iBreaklen = 0;
  if (nArg == 1) {
    nLen = 0x4b;
  }
  else {
    iVar1 = jx9_value_to_int(apArg[1]);
    nLen = 0x4b;
    if (0 < iVar1) {
      nLen = iVar1;
    }
    if ((2 < (uint)nArg) && (zString_00 = jx9_value_to_string(apArg[2],&iBreaklen), 0 < iBreaklen))
    goto LAB_0012cd35;
  }
  iBreaklen = 1;
  zString_00 = "\n";
LAB_0012cd35:
  pcVar2 = zString + iLen;
  while (zString < pcVar2) {
    iVar1 = (int)pcVar2 - (int)zString;
    if (iVar1 <= nLen) {
      nLen = iVar1;
    }
    jx9_result_string(pCtx,zString,nLen);
    zString = zString + nLen;
    if (zString < pcVar2) {
      jx9_result_string(pCtx,zString_00,iBreaklen);
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_wordwrap(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zIn, *zEnd, *zBreak;
	int iLen, iBreaklen, iChunk;
	if( nArg < 1 ){
		/* Missing arguments, return the empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Extract the input string */
	zIn = jx9_value_to_string(apArg[0], &iLen);
	if( iLen < 1 ){
		/* Nothing to process, return the empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Chunk length */
	iChunk = 75;
	iBreaklen = 0;
	zBreak = ""; /* cc warning */
	if( nArg > 1 ){
		iChunk = jx9_value_to_int(apArg[1]);
		if( iChunk < 1 ){
			iChunk = 75;
		}
		if( nArg > 2 ){
			zBreak = jx9_value_to_string(apArg[2], &iBreaklen);
		}
	}
	if( iBreaklen < 1 ){
		/* Set a default column break */
#ifdef __WINNT__
		zBreak = "\r\n";
		iBreaklen = (int)sizeof("\r\n")-1;
#else
		zBreak = "\n";
		iBreaklen = (int)sizeof(char);
#endif
	}
	/* Perform the requested operation */
	zEnd = &zIn[iLen];
	for(;;){
		int nMax;
		if( zIn >= zEnd ){
			/* No more input to process */
			break;
		}
		nMax = (int)(zEnd-zIn);
		if( iChunk > nMax ){
			iChunk = nMax;
		}
		/* Append the column first */
		jx9_result_string(pCtx, zIn, iChunk); /* Will make it's own copy */
		/* Advance the cursor */
		zIn += iChunk;
		if( zIn < zEnd ){
			/* Append the line break */
			jx9_result_string(pCtx, zBreak, iBreaklen);
		}
	}
	return JX9_OK;
}